

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void shader_unref(MOJOSHADER_glShader *shader)

{
  if (shader != (MOJOSHADER_glShader *)0x0) {
    if (shader->refcount < 2) {
      (*ctx->profileDeleteShader)(shader->handle);
      MOJOSHADER_freeParseData(shader->parseData);
      (*ctx->free_fn)(shader,ctx->malloc_data);
      return;
    }
    shader->refcount = shader->refcount - 1;
  }
  return;
}

Assistant:

static void shader_unref(MOJOSHADER_glShader *shader)
{
    if (shader != NULL)
    {
        const uint32 refcount = shader->refcount;
        if (refcount > 1)
            shader->refcount--;
        else
        {
            ctx->profileDeleteShader(shader->handle);
            MOJOSHADER_freeParseData(shader->parseData);
            Free(shader);
        } // else
    } // if
}